

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

void Macro_smpsFMvoice(uint arg_count,long *arg_array)

{
  long *arg_array_local;
  uint arg_count_local;
  
  if (arg_count != 0) {
    WriteByte(0xef);
    if ((target_driver < 3) || (arg_count < 2)) {
      WriteByte((uchar)*arg_array);
    }
    else {
      WriteByte((byte)*arg_array | 0x80);
      WriteByte((char)arg_array[1] + 0x81);
    }
    return;
  }
  __assert_fail("arg_count >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                ,0x2c3,"void Macro_smpsFMvoice(unsigned int, long *)");
}

Assistant:

static void Macro_smpsFMvoice(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 1);

	WriteByte(0xEF);

	if (target_driver >= 3 && arg_count >= 2)
	{
		WriteByte(arg_array[0] | 0x80);	// Instrument
		WriteByte(arg_array[1] + 0x81);	// ID of the song containing the instrument
	}
	else
	{
		WriteByte(arg_array[0]);	// Instrument
	}
}